

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeTest_AND(Fts5Expr *pExpr,Fts5ExprNode *pAnd)

{
  Fts5ExprNode *pFVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long in_RAX;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uStack_38;
  
  lVar8 = pAnd->iRowid;
  uStack_38 = in_RAX;
  do {
    pAnd->bNomatch = 0;
    if (pAnd->nChild < 1) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      lVar6 = 0;
      lVar7 = lVar8;
      do {
        pFVar1 = pAnd->apChild[lVar6];
        bVar2 = lVar7 < pFVar1->iRowid;
        if (pExpr->bDesc == 0) {
          bVar2 = pFVar1->iRowid < lVar7;
        }
        lVar8 = lVar7;
        if ((bVar2) && (uVar4 = (*pFVar1->xNext)(pExpr,pFVar1,1,lVar7), uVar4 != 0)) {
          pAnd->bNomatch = 0;
          iVar5 = 1;
          uStack_38 = (ulong)uVar4 << 0x20;
        }
        else if (pFVar1->bEof == 0) {
          lVar8 = pFVar1->iRowid;
          iVar5 = 0;
          if (lVar7 != lVar8) {
            bVar3 = false;
          }
          if (pFVar1->bNomatch != 0) {
            pAnd->bNomatch = 1;
          }
        }
        else {
          fts5ExprSetEof(pAnd);
          iVar5 = 4;
          bVar3 = true;
        }
        if (iVar5 != 0) {
          if (iVar5 != 4) {
            return uStack_38._4_4_;
          }
          break;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar8;
      } while (lVar6 < pAnd->nChild);
      bVar3 = !bVar3;
    }
    if (!bVar3) {
      if ((pAnd->bNomatch != 0) && (pExpr->pRoot != pAnd)) {
        fts5ExprNodeZeroPoslist(pAnd);
      }
      pAnd->iRowid = lVar8;
      return 0;
    }
  } while( true );
}

Assistant:

static int fts5ExprNodeTest_AND(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pAnd              /* FTS5_AND node to advance */
){
  int iChild;
  i64 iLast = pAnd->iRowid;
  int rc = SQLITE_OK;
  int bMatch;

  assert( pAnd->bEof==0 );
  do {
    pAnd->bNomatch = 0;
    bMatch = 1;
    for(iChild=0; iChild<pAnd->nChild; iChild++){
      Fts5ExprNode *pChild = pAnd->apChild[iChild];
      int cmp = fts5RowidCmp(pExpr, iLast, pChild->iRowid);
      if( cmp>0 ){
        /* Advance pChild until it points to iLast or laster */
        rc = fts5ExprNodeNext(pExpr, pChild, 1, iLast);
        if( rc!=SQLITE_OK ){
          pAnd->bNomatch = 0;
          return rc;
        }
      }

      /* If the child node is now at EOF, so is the parent AND node. Otherwise,
      ** the child node is guaranteed to have advanced at least as far as
      ** rowid iLast. So if it is not at exactly iLast, pChild->iRowid is the
      ** new lastest rowid seen so far.  */
      assert( pChild->bEof || fts5RowidCmp(pExpr, iLast, pChild->iRowid)<=0 );
      if( pChild->bEof ){
        fts5ExprSetEof(pAnd);
        bMatch = 1;
        break;
      }else if( iLast!=pChild->iRowid ){
        bMatch = 0;
        iLast = pChild->iRowid;
      }

      if( pChild->bNomatch ){
        pAnd->bNomatch = 1;
      }
    }
  }while( bMatch==0 );

  if( pAnd->bNomatch && pAnd!=pExpr->pRoot ){
    fts5ExprNodeZeroPoslist(pAnd);
  }
  pAnd->iRowid = iLast;
  return SQLITE_OK;
}